

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,longdouble kappa,longdouble delta,longdouble theta)

{
  longdouble *plVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  _Var5;
  bool bVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  _Head_base<0UL,_int_*,_false> _Var11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  tVar15;
  row_iterator prVar16;
  long lVar17;
  long lVar18;
  longdouble lVar19;
  undefined1 local_b8 [20];
  longdouble local_a4;
  longdouble local_98;
  int local_8c;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_88;
  long local_80;
  undefined1 local_78 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_68;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_60;
  unique_ptr<baryonyx::sparse_matrix<int>::row_value[],_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_58;
  ulong local_50;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_48;
  longdouble local_3c;
  
  local_68._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 8);
  local_3c = theta;
  local_98 = delta;
  local_a4 = kappa / ((longdouble)1 - kappa);
  local_60._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )last._M_current;
  do {
    if ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
         )first._M_current ==
        (_Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
         )local_60._M_t.
          super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl) {
      return false;
    }
    tVar15.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )(long)((row_value *)first._M_current)->value;
    if (*(int *)(this + 0x80) <= ((row_value *)first._M_current)->value) {
      details::fail_fast("Precondition","k < m",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"186");
    }
    iVar13 = (int)local_68._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl;
    local_58._M_t.
    super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (__uniq_ptr_data<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>,_true,_true>
          )(__uniq_ptr_data<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>,_true,_true>
            )first._M_current;
    sparse_matrix<int>::row((sparse_matrix<int> *)local_b8,iVar13);
    solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
    ::decrease_preference
              ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                *)this,(row_iterator)local_b8._8_8_,(row_iterator)local_b8._0_8_,local_3c);
    uVar14 = 0;
    for (_Var11._M_head_impl = (int *)local_b8._8_8_; _Var11._M_head_impl != (int *)local_b8._0_8_;
        _Var11._M_head_impl = _Var11._M_head_impl + 2) {
      sparse_matrix<int>::column((sparse_matrix<int> *)local_78,iVar13);
      lVar17 = *(long *)(this + 0x48);
      lVar19 = (longdouble)0;
      for (; local_78._8_8_ != local_78._0_8_; local_78._8_8_ = local_78._8_8_ + 8) {
        local_8c = *(int *)(lVar17 + (long)*(int *)local_78._8_8_ * 4);
        lVar19 = *(longdouble *)(*(long *)(this + 0x68) + (long)*(int *)local_78._8_8_ * 0x10) *
                 (longdouble)local_8c + lVar19;
      }
      lVar7 = *(long *)(this + 0x50);
      lVar10 = uVar14 * 0x20;
      *(int *)(lVar7 + 0x10 + lVar10) = (int)uVar14;
      uVar14 = uVar14 + 1;
      *(undefined4 *)(lVar7 + 0x14 + lVar10) =
           *(undefined4 *)(lVar17 + (long)*_Var11._M_head_impl * 4);
      *(longdouble *)(lVar7 + lVar10) =
           *(longdouble *)
            (*(long *)(*(long *)(this + 0x70) + 8) + (long)*(int *)(local_b8._8_8_ + 4) * 0x10) -
           lVar19;
    }
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>::rc_data*>
              (*(rc_data **)(this + 0x50),*(rc_data **)(this + 0x50) + (uVar14 & 0xffffffff),
               *(random_engine **)this);
    lVar17 = *(long *)(this + 0x58);
    local_80 = (long)tVar15.
                     super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                     .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                     _M_head_impl * 0xc;
    local_88._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )(tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
            )tVar15.
             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
             .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl;
    local_50 = uVar14;
    if (*(int *)(lVar17 + local_80) < 1) {
      iVar13 = 0;
      uVar14 = 0xffffffffffffffff;
LAB_0018ce16:
      bVar6 = iVar13 <= *(int *)(lVar17 + 4 + local_80);
    }
    else {
      lVar18 = -0x100000000;
      lVar10 = 0;
      local_48._M_head_impl = (col_value *)(long)((int)uVar14 + -2);
      lVar17 = *(long *)(this + 0x50);
      iVar13 = 0;
      lVar7 = -1;
      do {
        uVar4 = local_b8._8_8_;
        iVar13 = iVar13 + *(int *)(lVar17 + 0x14 + lVar10);
        lVar18 = lVar18 + 0x100000000;
        iVar2 = *(int *)(lVar17 + 0x10 + lVar10);
        iVar3 = *(int *)(*(long *)(this + 0x58) + local_80);
        bit_array_impl::set(&x->super_bit_array_impl,
                            ((row_iterator)(local_b8._8_8_ + (long)iVar2 * 8))->column);
        lVar17 = *(long *)(this + 0x50);
        lVar8 = (long)((row_iterator)(uVar4 + (long)iVar2 * 8))->value * 0x10;
        *(longdouble *)(*(long *)(this + 0x68) + lVar8) =
             *(longdouble *)(*(long *)(this + 0x68) + lVar8) +
             local_98 + local_a4 * *(longdouble *)(lVar17 + lVar10) * (longdouble)0.5;
        if (iVar3 <= iVar13) break;
        lVar10 = lVar10 + 0x20;
        bVar6 = lVar7 < (long)local_48._M_head_impl;
        lVar7 = lVar7 + 1;
      } while (bVar6);
      lVar17 = *(long *)(this + 0x58);
      uVar14 = lVar18 >> 0x20;
      if (*(int *)(lVar17 + local_80) <= iVar13) goto LAB_0018ce16;
      bVar6 = false;
    }
    uVar9 = (ulong)(int)(size_type)local_50;
    lVar17 = uVar14 << 5;
    uVar12 = uVar14;
    while( true ) {
      _Var5._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
           (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
            )(tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
              )local_88;
      uVar12 = uVar12 + 1;
      uVar14 = uVar14 + 1;
      if ((uVar9 <= uVar14) || (!bVar6)) break;
      lVar7 = *(long *)(this + 0x50);
      iVar13 = iVar13 + *(int *)(lVar7 + 0x34 + lVar17);
      if (iVar13 < *(int *)(*(long *)(this + 0x58) + local_80)) {
        prVar16 = (row_iterator)(local_b8._8_8_ + (long)*(int *)(lVar7 + 0x30 + lVar17) * 8);
LAB_0018cedd:
        bit_array_impl::unset(&x->super_bit_array_impl,prVar16->column);
        lVar7 = (long)prVar16->value * 0x10;
        *(longdouble *)(*(long *)(this + 0x68) + lVar7) =
             *(longdouble *)(*(long *)(this + 0x68) + lVar7) -
             (local_98 +
             local_a4 * *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar17) * (longdouble)0.5);
        bVar6 = false;
      }
      else {
        prVar16 = (row_iterator)(local_b8._8_8_ + (long)*(int *)(lVar7 + 0x30 + lVar17) * 8);
        if ((*(int *)(*(long *)(this + 0x58) + local_80 + 4) < iVar13) ||
           (bVar6 = stop_iterating<baryonyx::itm::maximize_tag,long_double>
                              (*(longdouble *)(lVar7 + 0x20 + lVar17),*(random_engine **)this),
           !bVar6)) goto LAB_0018cedd;
        bit_array_impl::set(&x->super_bit_array_impl,prVar16->column);
        lVar7 = (long)prVar16->value * 0x10;
        *(longdouble *)(*(long *)(this + 0x68) + lVar7) =
             *(longdouble *)(*(long *)(this + 0x68) + lVar7) +
             local_98 +
             local_a4 * *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar17) * (longdouble)0.5;
        bVar6 = true;
      }
      lVar17 = lVar17 + 0x20;
    }
    for (; uVar4 = local_b8._8_8_, uVar12 < uVar9; uVar12 = uVar12 + 1) {
      iVar13 = *(int *)(*(long *)(this + 0x50) + 0x30 + lVar17);
      bit_array_impl::unset
                (&x->super_bit_array_impl,
                 ((row_iterator)(local_b8._8_8_ + (long)iVar13 * 8))->column);
      plVar1 = (longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar17);
      lVar17 = lVar17 + 0x20;
      lVar7 = (long)((row_iterator)(uVar4 + (long)iVar13 * 8))->value * 0x10;
      *(longdouble *)(*(long *)(this + 0x68) + lVar7) =
           *(longdouble *)(*(long *)(this + 0x68) + lVar7) -
           (local_98 + local_a4 * *plVar1 * (longdouble)0.5);
    }
    bVar6 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>>,baryonyx::bit_array>
                      ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                        *)this,(int)_Var5._M_t.
                                    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                                    .
                                    super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>
                                    ._M_head_impl,x);
    if (!bVar6) {
      details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"335");
    }
    first._M_current =
         (pair<int,_int> *)
         ((long)local_58._M_t.
                super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                _M_head_impl + 8);
  } while( true );
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }